

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::dragMoveEvent(QTextEdit *this,QDragMoveEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  bool bVar2;
  bool bVar3;
  LayoutDirection LVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  dVar8 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(e + 0x10);
  bVar2 = 2147483647.0 < dVar8;
  if (dVar8 <= -2147483648.0) {
    dVar8 = -2147483648.0;
  }
  dVar7 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(e + 0x18);
  bVar3 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  *(ulong *)(lVar1 + 0x30c) =
       CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar7),
                (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar8));
  if (*(int *)(lVar1 + 0x308) == 0) {
    QBasicTimer::start(lVar1 + 0x308,100000000,1,this);
  }
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  LVar4 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 8));
  if (LVar4 == RightToLeft) {
    iVar5 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar6 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar5 = iVar5 - iVar6;
  }
  else {
    iVar5 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  }
  iVar6 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  local_38.yp = (qreal)iVar6;
  local_38.xp = (double)iVar5;
  QWidgetTextControl::processEvent(this_00,(QEvent *)e,&local_38,*(QWidget **)(lVar1 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QTextEdit);
    d->autoScrollDragPos = e->position().toPoint();
    if (!d->autoScrollTimer.isActive())
        d->autoScrollTimer.start(100, this);
    d->sendControlEvent(e);
}